

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

bool __thiscall FWadFile::IsMarker(FWadFile *this,int lump,char *marker)

{
  int iVar1;
  char *marker_local;
  int lump_local;
  FWadFile *this_local;
  
  if (this->Lumps[lump].super_FResourceLump.field_3.Name[0] == *marker) {
    iVar1 = strcmp(this->Lumps[lump].super_FResourceLump.field_3.Name,marker);
    this_local._7_1_ = true;
    if ((iVar1 != 0) && (this_local._7_1_ = false, marker[1] == '_')) {
      iVar1 = strcmp(this->Lumps[lump].super_FResourceLump.field_3.Name + 1,marker);
      this_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool FWadFile::IsMarker(int lump, const char *marker)
{
	if (Lumps[lump].Name[0] == marker[0])
	{
		return (!strcmp(Lumps[lump].Name, marker) ||
			(marker[1] == '_' && !strcmp(Lumps[lump].Name+1, marker)));
	}
	else return false;
}